

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResourceManager.cpp
# Opt level: O2

bool __thiscall ResourceManager::add(ResourceManager *this,Resource *res,bool load)

{
  int iVar1;
  undefined3 in_register_00000011;
  Resource *local_10;
  
  local_10 = res;
  std::vector<Resource_*,_std::allocator<Resource_*>_>::push_back(&this->resources,&local_10);
  if ((CONCAT31(in_register_00000011,load) != 0) &&
     (iVar1 = (*local_10->_vptr_Resource[1])(), (char)iVar1 == '\0')) {
    return false;
  }
  return true;
}

Assistant:

bool ResourceManager::add(Resource* res, bool load)
{
   // We have to add the resource even if loading fails, if we want to be able
   // to continue without the resource (e.g. samples).
   resources.push_back(res);
   if (load) {
      if (!res->load())
         return false;
   }
   return true;
}